

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arrow_duck_schema.cpp
# Opt level: O0

unordered_map<unsigned_long,_const_duckdb::shared_ptr<duckdb::ArrowTypeExtensionData,_true>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_const_duckdb::shared_ptr<duckdb::ArrowTypeExtensionData,_true>_>_>_>
* duckdb::ArrowTypeExtensionData::GetExtensionTypes
            (ClientContext *context,vector<duckdb::LogicalType,_true> *duckdb_types)

{
  bool bVar1;
  DBConfig *pDVar2;
  size_type sVar3;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *in_RDX;
  unordered_map<unsigned_long,_const_duckdb::shared_ptr<duckdb::ArrowTypeExtensionData,_true>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_const_duckdb::shared_ptr<duckdb::ArrowTypeExtensionData,_true>_>_>_>
  *in_RDI;
  pair<std::__detail::_Node_iterator<std::pair<const_unsigned_long,_const_duckdb::shared_ptr<duckdb::ArrowTypeExtensionData,_true>_>,_false,_false>,_bool>
  pVar4;
  LogicalType *in_stack_00000040;
  DBConfig *in_stack_00000048;
  idx_t i;
  DBConfig *db_config;
  unordered_map<unsigned_long,_const_duckdb::shared_ptr<duckdb::ArrowTypeExtensionData,_true>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_const_duckdb::shared_ptr<duckdb::ArrowTypeExtensionData,_true>_>_>_>
  *extension_types;
  ArrowTypeExtension *in_stack_fffffffffffffe88;
  undefined7 in_stack_fffffffffffffe90;
  undefined1 in_stack_fffffffffffffe97;
  _Node_iterator_base<std::pair<const_unsigned_long,_const_duckdb::shared_ptr<duckdb::ArrowTypeExtensionData,_true>_>,_false>
  in_stack_fffffffffffffe98;
  DBConfig *this;
  undefined1 in_stack_fffffffffffffef0;
  undefined7 in_stack_fffffffffffffef1;
  DBConfig *in_stack_fffffffffffffef8;
  undefined8 local_40;
  
  ::std::
  unordered_map<unsigned_long,_const_duckdb::shared_ptr<duckdb::ArrowTypeExtensionData,_true>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_const_duckdb::shared_ptr<duckdb::ArrowTypeExtensionData,_true>_>_>_>
  ::unordered_map((unordered_map<unsigned_long,_const_duckdb::shared_ptr<duckdb::ArrowTypeExtensionData,_true>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_const_duckdb::shared_ptr<duckdb::ArrowTypeExtensionData,_true>_>_>_>
                   *)0x1a27a89);
  pDVar2 = DBConfig::GetConfig((ClientContext *)0x1a27a96);
  for (local_40 = 0;
      sVar3 = ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::size(in_RDX)
      , local_40 < sVar3; local_40 = local_40 + 1) {
    vector<duckdb::LogicalType,_true>::operator[]
              ((vector<duckdb::LogicalType,_true> *)
               CONCAT17(in_stack_fffffffffffffe97,in_stack_fffffffffffffe90),
               (size_type)in_stack_fffffffffffffe88);
    bVar1 = DBConfig::HasArrowExtension
                      (in_stack_fffffffffffffef8,
                       (LogicalType *)CONCAT71(in_stack_fffffffffffffef1,in_stack_fffffffffffffef0))
    ;
    if (bVar1) {
      this = pDVar2;
      vector<duckdb::LogicalType,_true>::operator[]
                ((vector<duckdb::LogicalType,_true> *)
                 CONCAT17(in_stack_fffffffffffffe97,in_stack_fffffffffffffe90),
                 (size_type)in_stack_fffffffffffffe88);
      DBConfig::GetArrowExtension(in_stack_00000048,in_stack_00000040);
      ArrowTypeExtension::GetTypeExtension(in_stack_fffffffffffffe88);
      ::std::
      pair<const_unsigned_long,_const_duckdb::shared_ptr<duckdb::ArrowTypeExtensionData,_true>_>::
      pair<unsigned_long_&,_duckdb::shared_ptr<duckdb::ArrowTypeExtensionData,_true>,_true>
                ((pair<const_unsigned_long,_const_duckdb::shared_ptr<duckdb::ArrowTypeExtensionData,_true>_>
                  *)CONCAT17(in_stack_fffffffffffffe97,in_stack_fffffffffffffe90),
                 (unsigned_long *)in_stack_fffffffffffffe88,
                 (shared_ptr<duckdb::ArrowTypeExtensionData,_true> *)0x1a27b9c);
      pVar4 = ::std::
              unordered_map<unsigned_long,_const_duckdb::shared_ptr<duckdb::ArrowTypeExtensionData,_true>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_const_duckdb::shared_ptr<duckdb::ArrowTypeExtensionData,_true>_>_>_>
              ::insert((unordered_map<unsigned_long,_const_duckdb::shared_ptr<duckdb::ArrowTypeExtensionData,_true>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_const_duckdb::shared_ptr<duckdb::ArrowTypeExtensionData,_true>_>_>_>
                        *)this,(value_type *)in_stack_fffffffffffffe98._M_cur);
      in_stack_fffffffffffffe98._M_cur =
           (__node_type *)
           pVar4.first.
           super__Node_iterator_base<std::pair<const_unsigned_long,_const_duckdb::shared_ptr<duckdb::ArrowTypeExtensionData,_true>_>,_false>
           ._M_cur;
      in_stack_fffffffffffffe97 = pVar4.second;
      in_stack_fffffffffffffef0 = in_stack_fffffffffffffe97;
      ::std::
      pair<const_unsigned_long,_const_duckdb::shared_ptr<duckdb::ArrowTypeExtensionData,_true>_>::
      ~pair((pair<const_unsigned_long,_const_duckdb::shared_ptr<duckdb::ArrowTypeExtensionData,_true>_>
             *)0x1a27bda);
      shared_ptr<duckdb::ArrowTypeExtensionData,_true>::~shared_ptr
                ((shared_ptr<duckdb::ArrowTypeExtensionData,_true> *)0x1a27be7);
      ArrowTypeExtension::~ArrowTypeExtension
                ((ArrowTypeExtension *)CONCAT17(in_stack_fffffffffffffe97,in_stack_fffffffffffffe90)
                );
    }
  }
  return in_RDI;
}

Assistant:

unordered_map<idx_t, const shared_ptr<ArrowTypeExtensionData>>
ArrowTypeExtensionData::GetExtensionTypes(ClientContext &context, const vector<LogicalType> &duckdb_types) {
	unordered_map<idx_t, const shared_ptr<ArrowTypeExtensionData>> extension_types;
	const auto &db_config = DBConfig::GetConfig(context);
	for (idx_t i = 0; i < duckdb_types.size(); i++) {
		if (db_config.HasArrowExtension(duckdb_types[i])) {
			extension_types.insert({i, db_config.GetArrowExtension(duckdb_types[i]).GetTypeExtension()});
		}
	}
	return extension_types;
}